

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

void getstacktrace(void **ents,int max_ents)

{
  void **ppvVar1;
  ulong uVar2;
  ulong uVar3;
  void **ip;
  void **bp;
  
  getframe();
  uVar2 = 0;
  uVar3 = (ulong)(uint)max_ents;
  if (max_ents < 1) {
    uVar3 = uVar2;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      return;
    }
    ppvVar1 = (void **)*ip;
    if (((ppvVar1 <= ip) || (0x80000 < (long)ppvVar1 - (long)ip)) || (ip[1] == (void *)0x0)) break;
    ents[uVar2] = ip[1];
    uVar2 = uVar2 + 1;
    ip = ppvVar1;
  }
  ents[uVar2] = (void *)0x0;
  return;
}

Assistant:

static void getstacktrace(void **ents, int max_ents) {
    void **ip, **bp, **newBp;
    getframe(&bp, &ip);
    int frameno;
    for (frameno = 0; frameno < max_ents; ++frameno) {
        newBp = (void **)bp[0];
        ip = (void **)bp[1];
        /*
         * Make sure we are making progress, terminate on massive stack frames,
         * or when IP == 0
         */
        if (!newBp || newBp <= bp || newBp - bp > 65536 || ip == 0)
            break;
        bp = newBp;
        ents[frameno] = ip;
    }
    if (frameno < max_ents) // null terminate if less than full size.
       ents[frameno] = 0;
}